

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::clearshrink_test::test_method(clearshrink_test *this)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  _Bit_type *p_Var4;
  _Bit_pointer puVar5;
  long lVar6;
  _Deque_base<int,_std::allocator<int>_> *p_Var7;
  _Deque_base<int,_std::allocator<int>_> *p_Var8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long in_FS_OFFSET;
  byte bVar11;
  initializer_list<unsigned_char> __l;
  const_string file;
  const_string file_00;
  initializer_list<bool> __l_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  assertion_result local_1d0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined4 local_16c;
  long local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined4 *local_140;
  lazy_ostream local_138;
  undefined1 *local_128;
  undefined4 **local_120;
  long *local_110;
  char *local_108;
  char *local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  _Deque_base<int,_std::allocator<int>_> local_d8;
  vector<bool,_std::allocator<bool>_> v_1;
  
  bVar11 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT53(v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p._3_5_,0x30201);
  __l._M_len = 3;
  __l._M_array = (iterator)&v_1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&v,__l,(allocator_type *)&local_d8);
  puVar3 = v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar2 = v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
  }
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x718;
  file.m_begin = (iterator)&local_150;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_168 = (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_120 = (undefined4 **)0xf6cf21;
  local_110 = &local_168;
  local_140 = &local_16c;
  local_16c = 0;
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_110;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_013abb70;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)boost::unit_test::lazy_ostream::inst;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_140;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       local_d8._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_013abcf0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_168 == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_138,1,2,REQUIRE,0xf6c6cb,(size_t)&local_108,0x718,&v_1,"0",
             (allocator_type *)&local_d8);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x719;
  file_00.m_begin = (iterator)&local_180;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = (undefined4 **)0xf6cf21;
  local_168 = (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
              (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_168 == 0);
  local_16c = 0;
  local_1d0.m_message.px = (element_type *)0x0;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_110 = &local_168;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_013abb70;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)boost::unit_test::lazy_ostream::inst;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_110;
  local_140 = &local_16c;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       local_d8._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_013abcf0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_140;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d0,&local_138,1,2,REQUIRE,0xf7466b,(size_t)&local_108,0x719,&v_1,"0",
             (allocator_type *)&local_d8);
  boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
  if (v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_d8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)CONCAT26(local_d8._M_impl.super__Deque_impl_data._M_map._6_2_,0x10100000100);
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&local_d8;
  std::vector<bool,_std::allocator<bool>_>::vector(&v_1,__l_00,(allocator_type *)&local_138);
  puVar5 = v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
  p_Var4 = v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._12_4_ = 0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
  if (p_Var4 != (_Bit_type *)0x0) {
    operator_delete(p_Var4,(long)puVar5 - (long)p_Var4);
  }
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x71f;
  file_01.m_begin = (iterator)&local_1a0;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b0,
             msg_01);
  local_1d0.m_message.px = (element_type *)((ulong)local_1d0.m_message.px & 0xffffffffffffff00);
  local_1d0._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_168 = ((long)v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                     ._M_finish.super__Bit_iterator_base._M_p -
              (long)v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p) * 8 +
              (v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff);
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,local_168 == 0);
  local_16c = 0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_110 = &local_168;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       local_d8._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_013abb70;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_110;
  local_140 = &local_16c;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v,(lazy_ostream *)&local_1d0,1,2,REQUIRE,0xf6c6cb,
             (size_t)&local_108,0x71f,&local_d8,"0",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x720;
  file_02.m_begin = (iterator)&local_1e0;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
             msg_02);
  local_168 = ((long)v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                     ._M_end_of_storage -
              (long)v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p) * 8;
  local_1d0.m_message.px = (element_type *)((ulong)local_1d0.m_message.px & 0xffffffffffffff00);
  local_1d0._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,
                         v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage ==
                         v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  local_16c = 0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_110 = &local_168;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       local_d8._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR__lazy_ostream_013abb70;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)boost::unit_test::lazy_ostream::inst;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)&local_110;
  local_140 = &local_16c;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v,(lazy_ostream *)&local_1d0,1,2,REQUIRE,0xf7466b,
             (size_t)&local_108,0x720,&local_d8,"0",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p,
                    (long)v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
         super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x300000001;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 3;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 7;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::deque<int,std::allocator<int>>::_M_range_initialize<int_const*>();
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._12_4_ = 0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&v_1,0);
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._8_8_;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p;
  local_d8._M_impl.super__Deque_impl_data._M_map_size =
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._8_8_;
  local_d8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  local_138._vptr_lazy_ostream =
       (_func_int **)
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  local_138._8_8_ =
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._8_8_;
  p_Var7 = &local_d8;
  p_Var8 = (_Deque_base<int,_std::allocator<int>_> *)&v_1;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (p_Var8->_M_impl).super__Deque_impl_data._M_map =
         (p_Var7->_M_impl).super__Deque_impl_data._M_map;
    p_Var7 = (_Deque_base<int,_std::allocator<int>_> *)((long)p_Var7 + ((ulong)bVar11 * -2 + 1) * 8)
    ;
    p_Var8 = (_Deque_base<int,_std::allocator<int>_> *)((long)p_Var8 + ((ulong)bVar11 * -2 + 1) * 8)
    ;
  }
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&v_1);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x726;
  file_03.m_begin = (iterator)&local_200;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_210,
             msg_03);
  local_1d0.m_message.px = (element_type *)((ulong)local_1d0.m_message.px & 0xffffffffffffff00);
  local_1d0._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_168 = ((long)local_d8._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
              ((long)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
              ((((ulong)((long)local_d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(local_d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                     )) * 0x80;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,local_168 == 0);
  local_16c = 0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_110 = &local_168;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_013abb70;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)boost::unit_test::lazy_ostream::inst;
  v_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_110;
  local_140 = &local_16c;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v,(lazy_ostream *)&local_1d0,1,2,REQUIRE,0xf6c6cb,
             (size_t)&local_108,0x726,(_Deque_base<int,_std::allocator<int>_> *)&v_1,"0",&local_138)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(clearshrink_test)
{
    {
        std::vector<uint8_t> v = {1, 2, 3};
        ClearShrink(v);
        BOOST_CHECK_EQUAL(v.size(), 0);
        BOOST_CHECK_EQUAL(v.capacity(), 0);
    }

    {
        std::vector<bool> v = {false, true, false, false, true, true};
        ClearShrink(v);
        BOOST_CHECK_EQUAL(v.size(), 0);
        BOOST_CHECK_EQUAL(v.capacity(), 0);
    }

    {
        std::deque<int> v = {1, 3, 3, 7};
        ClearShrink(v);
        BOOST_CHECK_EQUAL(v.size(), 0);
        // std::deque has no capacity() we can observe.
    }
}